

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void __thiscall HighsBasis::printScalars(HighsBasis *this,string *message)

{
  undefined8 uVar1;
  byte *in_RDI;
  
  uVar1 = std::__cxx11::string::c_str();
  printf("\nBasis: %s\n",uVar1);
  printf(" valid = %d\n",(ulong)(*in_RDI & 1));
  printf(" alien = %d\n",(ulong)(in_RDI[1] & 1));
  printf(" useful = %d\n",(ulong)(in_RDI[2] & 1));
  printf(" was_alien = %d\n",(ulong)(in_RDI[3] & 1));
  printf(" debug_id = %d\n",(ulong)*(uint *)(in_RDI + 4));
  printf(" debug_update_count = %d\n",(ulong)*(uint *)(in_RDI + 8));
  uVar1 = std::__cxx11::string::c_str();
  printf(" debug_origin_name = %s\n",uVar1);
  return;
}

Assistant:

void HighsBasis::printScalars(std::string message) const {
  printf("\nBasis: %s\n", message.c_str());
  printf(" valid = %d\n", this->valid);
  printf(" alien = %d\n", this->alien);
  printf(" useful = %d\n", this->useful);
  printf(" was_alien = %d\n", this->was_alien);
  printf(" debug_id = %d\n", int(this->debug_id));
  printf(" debug_update_count = %d\n", int(this->debug_update_count));
  printf(" debug_origin_name = %s\n", this->debug_origin_name.c_str());
}